

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QTime __thiscall QLocale::toTime(QLocale *this,QString *string,FormatType format)

{
  QTime QVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  timeFormat((QString *)&QStack_38,this,format);
  QVar1 = toTime(this,string,(QString *)&QStack_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QTime)QVar1.mds;
  }
  __stack_chk_fail();
}

Assistant:

QTime QLocale::toTime(const QString &string, FormatType format) const
{
    return toTime(string, timeFormat(format));
}